

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)::
Value_const__(Value *__return_storage_ptr__,void *this,Value *source)

{
  uint uVar1;
  long *plVar2;
  ConstantTable *this_00;
  double dVar3;
  pointer puVar4;
  Category CVar5;
  bool bVar6;
  Handle HVar7;
  Value *extraout_RAX;
  int64_t iVar8;
  Handle handle;
  Value *source_00;
  Value *pVVar9;
  Value *extraout_RAX_00;
  Structure *pSVar10;
  Value *extraout_RAX_01;
  Value *extraout_RAX_02;
  Value *extraout_RAX_03;
  Value *extraout_RAX_04;
  uint *in_RCX;
  char *pcVar11;
  size_t sVar12;
  pointer puVar13;
  ulong uVar14;
  StringDictionary *pSVar15;
  string_view sVar16;
  string_view name;
  Type elementType;
  Value local_1b0;
  undefined1 local_170 [8];
  Value local_168;
  SubElementPath local_100;
  Member *local_c8;
  size_t local_c0;
  char *local_b8;
  Type local_b0;
  Value local_98;
  
  CVar5 = (source->type).category;
  if (CVar5 == stringLiteral) {
    plVar2 = *(long **)((long)this + 8);
    HVar7 = getStringLiteral(source);
    sVar16 = (string_view)(**(code **)(*plVar2 + 0x18))(plVar2,HVar7.handle);
    choc::value::Value::Value(__return_storage_ptr__,sVar16);
    return extraout_RAX;
  }
  if (CVar5 == vector) {
    uVar1 = (source->type).boundingSize;
    uVar14 = (ulong)uVar1;
    Type::getElementType(&local_b0,&source->type);
    in_RCX = &switchD_001a340c::switchdataD_00257178;
    switch(local_b0.primitiveType.type) {
    case float32:
      local_170[0] = 0x30;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x100 < uVar1) {
        choc::value::throwError("Too many vector elements");
      }
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,0x14);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
      puVar4 = local_168.packedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar13 = local_168.packedData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_170[0] < '\0') {
        if (local_170[0] == 0x90) {
          if ((Object *)
              local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (Object *)0x0) {
            choc::value::Type::Object::~Object
                      ((Object *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001a3ea2;
          }
        }
        else if ((local_170[0] == 0x80) &&
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (Object *)0x0)) {
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           local_168.packedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
LAB_001a3ea2:
          if ((Allocator *)puVar4 == (Allocator *)0x0) {
            free(puVar13);
          }
          else {
            (**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
          }
        }
      }
      if (uVar1 != 0) {
        puVar13 = (__return_storage_ptr__->packedData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          SubElementPath::SubElementPath((SubElementPath *)&local_1b0,sVar12);
          getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
          getData((PackedData *)&local_100,(Value *)local_170);
          dVar3 = PackedData::getAsDouble((PackedData *)&local_100);
          ~Value((Value *)local_170);
          local_1b0.type.boundingSize = 0;
          local_1b0.type.arrayElementBoundingSize = 0;
          if (((Structure *)0x4 < local_1b0.type.structure.object) &&
             ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
            operator_delete__((void *)local_1b0.type._0_8_);
          }
          *(float *)(puVar13 + sVar12 * 4) = (float)dVar3;
          sVar12 = sVar12 + 1;
        } while (uVar14 != sVar12);
      }
LAB_001a3cb9:
      RefCountedPtr<soul::Structure>::decIfNotNull(local_b0.structure.object);
      return extraout_RAX_03;
    case float64:
      local_170[0] = 0x30;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x100 < uVar1) {
        choc::value::throwError("Too many vector elements");
      }
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,0x18);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
      puVar4 = local_168.packedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar13 = local_168.packedData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_170[0] < '\0') {
        if (local_170[0] == 0x90) {
          if ((Object *)
              local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (Object *)0x0) {
            choc::value::Type::Object::~Object
                      ((Object *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001a3ed7;
          }
        }
        else if ((local_170[0] == 0x80) &&
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (Object *)0x0)) {
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           local_168.packedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
LAB_001a3ed7:
          if ((Allocator *)puVar4 == (Allocator *)0x0) {
            free(puVar13);
          }
          else {
            (**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
          }
        }
      }
      if (uVar1 != 0) {
        puVar13 = (__return_storage_ptr__->packedData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          SubElementPath::SubElementPath((SubElementPath *)&local_1b0,sVar12);
          getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
          getData((PackedData *)&local_100,(Value *)local_170);
          dVar3 = PackedData::getAsDouble((PackedData *)&local_100);
          ~Value((Value *)local_170);
          local_1b0.type.boundingSize = 0;
          local_1b0.type.arrayElementBoundingSize = 0;
          if (((Structure *)0x4 < local_1b0.type.structure.object) &&
             ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
            operator_delete__((void *)local_1b0.type._0_8_);
          }
          *(double *)(puVar13 + sVar12 * 8) = dVar3;
          sVar12 = sVar12 + 1;
        } while (uVar14 != sVar12);
      }
      goto LAB_001a3cb9;
    default:
      RefCountedPtr<soul::Structure>::decIfNotNull(local_b0.structure.object);
      CVar5 = (source->type).category;
      break;
    case int32:
      local_170[0] = 0x30;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x100 < uVar1) {
        choc::value::throwError("Too many vector elements");
      }
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,4);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
      puVar4 = local_168.packedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar13 = local_168.packedData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_170[0] < '\0') {
        if (local_170[0] == 0x90) {
          if ((Object *)
              local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (Object *)0x0) {
            choc::value::Type::Object::~Object
                      ((Object *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001a3e6d;
          }
        }
        else if ((local_170[0] == 0x80) &&
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (Object *)0x0)) {
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           local_168.packedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
LAB_001a3e6d:
          if ((Allocator *)puVar4 == (Allocator *)0x0) {
            free(puVar13);
          }
          else {
            (**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
          }
        }
      }
      if (uVar1 != 0) {
        puVar13 = (__return_storage_ptr__->packedData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          SubElementPath::SubElementPath((SubElementPath *)&local_1b0,sVar12);
          getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
          getData((PackedData *)&local_100,(Value *)local_170);
          iVar8 = PackedData::getAsInt64((PackedData *)&local_100);
          ~Value((Value *)local_170);
          local_1b0.type.boundingSize = 0;
          local_1b0.type.arrayElementBoundingSize = 0;
          if (((Structure *)0x4 < local_1b0.type.structure.object) &&
             ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
            operator_delete__((void *)local_1b0.type._0_8_);
          }
          *(int *)(puVar13 + sVar12 * 4) = (int)iVar8;
          sVar12 = sVar12 + 1;
        } while (uVar14 != sVar12);
      }
      goto LAB_001a3cb9;
    case int64:
      local_170[0] = 0x30;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x100 < uVar1) {
        choc::value::throwError("Too many vector elements");
      }
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,8);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
      puVar4 = local_168.packedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar13 = local_168.packedData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_170[0] < '\0') {
        if (local_170[0] == 0x90) {
          if ((Object *)
              local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (Object *)0x0) {
            choc::value::Type::Object::~Object
                      ((Object *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001a3f0c;
          }
        }
        else if ((local_170[0] == 0x80) &&
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (Object *)0x0)) {
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           local_168.packedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
LAB_001a3f0c:
          if ((Allocator *)puVar4 == (Allocator *)0x0) {
            free(puVar13);
          }
          else {
            (**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
          }
        }
      }
      if (uVar1 != 0) {
        puVar13 = (__return_storage_ptr__->packedData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          SubElementPath::SubElementPath((SubElementPath *)&local_1b0,sVar12);
          getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
          getData((PackedData *)&local_100,(Value *)local_170);
          iVar8 = PackedData::getAsInt64((PackedData *)&local_100);
          ~Value((Value *)local_170);
          local_1b0.type.boundingSize = 0;
          local_1b0.type.arrayElementBoundingSize = 0;
          if (((Structure *)0x4 < local_1b0.type.structure.object) &&
             ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
            operator_delete__((void *)local_1b0.type._0_8_);
          }
          *(int64_t *)(puVar13 + sVar12 * 8) = iVar8;
          sVar12 = sVar12 + 1;
        } while (uVar14 != sVar12);
      }
      goto LAB_001a3cb9;
    case bool_:
      local_170[0] = 0x30;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x100 < uVar1) {
        choc::value::throwError("Too many vector elements");
      }
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,1);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
      puVar4 = local_168.packedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar13 = local_168.packedData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((char)local_170[0] < '\0') {
        if (local_170[0] == 0x90) {
          if ((Object *)
              local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (Object *)0x0) {
            choc::value::Type::Object::~Object
                      ((Object *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001a3f3d;
          }
        }
        else if ((local_170[0] == 0x80) &&
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (Object *)0x0)) {
          choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           local_168.packedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
LAB_001a3f3d:
          if ((Allocator *)puVar4 == (Allocator *)0x0) {
            free(puVar13);
          }
          else {
            (**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
          }
        }
      }
      if (uVar1 != 0) {
        puVar13 = (__return_storage_ptr__->packedData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          SubElementPath::SubElementPath((SubElementPath *)&local_1b0,sVar12);
          getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
          getData((PackedData *)&local_100,(Value *)local_170);
          bVar6 = PackedData::getAsBool((PackedData *)&local_100);
          ~Value((Value *)local_170);
          local_1b0.type.boundingSize = 0;
          local_1b0.type.arrayElementBoundingSize = 0;
          if (((Structure *)0x4 < local_1b0.type.structure.object) &&
             ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
            operator_delete__((void *)local_1b0.type._0_8_);
          }
          puVar13[sVar12] = bVar6;
          sVar12 = sVar12 + 1;
        } while (uVar14 != sVar12);
      }
      goto LAB_001a3cb9;
    }
  }
  else if (CVar5 == primitive) {
    switch((source->type).primitiveType.type) {
    case float32:
      getData((PackedData *)local_170,source);
      dVar3 = PackedData::getAsDouble((PackedData *)local_170);
      local_1b0.type._0_4_ = (float)dVar3;
      local_170[0] = 0x14;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)&local_1b0,(uchar *)((long)&local_1b0 + 4),(allocator_type *)&local_100);
      (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002cab48;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar13 = (__return_storage_ptr__->packedData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (__return_storage_ptr__->value).type.mainType = float32;
      break;
    case float64:
      getData((PackedData *)local_170,source);
      local_1b0.type._0_8_ = PackedData::getAsDouble((PackedData *)local_170);
      local_170[0] = 0x18;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)&local_1b0,(uchar *)&local_1b0.type.boundingSize,
                 (allocator_type *)&local_100);
      (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002cab48;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar13 = (__return_storage_ptr__->packedData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (__return_storage_ptr__->value).type.mainType = float64;
      break;
    default:
      goto switchD_001a3356_caseD_4;
    case int32:
      getData((PackedData *)local_170,source);
      iVar8 = PackedData::getAsInt64((PackedData *)local_170);
      local_1b0.type._0_4_ = (int)iVar8;
      local_170[0] = wrap;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)&local_1b0,(uchar *)((long)&local_1b0 + 4),(allocator_type *)&local_100);
      (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002cab48;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar13 = (__return_storage_ptr__->packedData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (__return_storage_ptr__->value).type.mainType = int32;
      break;
    case int64:
      getData((PackedData *)local_170,source);
      local_1b0.type._0_8_ = PackedData::getAsInt64((PackedData *)local_170);
      local_170[0] = 8;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)&local_1b0,(uchar *)&local_1b0.type.boundingSize,
                 (allocator_type *)&local_100);
      (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002cab48;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar13 = (__return_storage_ptr__->packedData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (__return_storage_ptr__->value).type.mainType = int64;
      break;
    case bool_:
      getData((PackedData *)local_170,source);
      local_100.indexes.items._0_1_ = (allocator_type)PackedData::getAsBool((PackedData *)local_170)
      ;
      local_170[0] = primitive;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)&local_100,(uchar *)((long)&local_100.indexes.items + 1),
                 (allocator_type *)&local_1b0);
      (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002cab48;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar13 = (__return_storage_ptr__->packedData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (__return_storage_ptr__->value).type.mainType = boolean;
    }
    (__return_storage_ptr__->value).type.content.object =
         (Object *)
         local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)((long)&(__return_storage_ptr__->value).type.content + 8) =
         local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
    (__return_storage_ptr__->value).data = puVar13;
    (__return_storage_ptr__->value).stringDictionary =
         &(__return_storage_ptr__->dictionary).super_StringDictionary;
    return &local_168;
  }
  pcVar11 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),CVar5 == array);
  uVar1 = (source->type).boundingSize;
  if (uVar1 == 0 && CVar5 == array) {
    this_00 = *this;
    handle = getUnsizedArrayContent(source);
    source_00 = ConstantTable::getValueForHandle(this_00,handle);
    if (source_00 != (Value *)0x0) {
      pVVar9 = Value_const__(__return_storage_ptr__,this,source_00);
      return pVVar9;
    }
    throwInternalCompilerError("target != nullptr","convert",0x379);
  }
  if (CVar5 != array) {
    if (CVar5 == structure) {
      pSVar10 = Type::getStructRef(&source->type);
      sVar16._M_str = pcVar11;
      sVar16._M_len = (size_t)(pSVar10->name)._M_dataplus._M_p;
      choc::value::createObject
                (__return_storage_ptr__,(value *)(pSVar10->name)._M_string_length,sVar16);
      pVVar9 = (Value *)(pSVar10->members).numActive;
      if (pVVar9 == (Value *)0x0) {
        return (Value *)0x0;
      }
      local_c8 = (pSVar10->members).items;
      local_168.value.stringDictionary = (StringDictionary *)((long)pVVar9 << 6);
      pSVar15 = (StringDictionary *)0x0;
      local_c0 = 0;
      do {
        local_b8 = *(char **)((long)&pSVar15[3]._vptr_StringDictionary + (long)local_c8);
        sVar12 = *(size_t *)((long)&pSVar15[4]._vptr_StringDictionary + (long)local_c8);
        SubElementPath::SubElementPath((SubElementPath *)&local_1b0,local_c0);
        getSubElement((Value *)local_170,source,(SubElementPath *)&local_1b0);
        Value_const__(&local_98,this,(Value *)local_170);
        name._M_str = local_b8;
        name._M_len = sVar12;
        choc::value::Value::addMember<choc::value::Value>(__return_storage_ptr__,name,&local_98);
        choc::value::Value::~Value(&local_98);
        ~Value((Value *)local_170);
        local_1b0.type.boundingSize = 0;
        local_1b0.type.arrayElementBoundingSize = 0;
        pVVar9 = extraout_RAX_01;
        if (((Structure *)0x4 < local_1b0.type.structure.object) &&
           ((unsigned_long *)local_1b0.type._0_8_ != (unsigned_long *)0x0)) {
          operator_delete__((void *)local_1b0.type._0_8_);
          pVVar9 = extraout_RAX_02;
        }
        pSVar15 = pSVar15 + 8;
        local_c0 = local_c0 + 1;
      } while (local_168.value.stringDictionary != pSVar15);
      return pVVar9;
    }
switchD_001a3356_caseD_4:
    throwInternalCompilerError("convert",0x38d);
  }
  local_170[0] = 0x40;
  local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  choc::value::Value::Value(__return_storage_ptr__,(Type *)local_170);
  puVar4 = local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar13 = local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (Value *)(ulong)local_170[0];
  if ((char)local_170[0] < '\0') {
    if (local_170[0] == 0x90) {
      if ((Object *)
          local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start == (Object *)0x0) goto LAB_001a3795;
      choc::value::Type::Object::~Object
                ((Object *)
                 local_168.packedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    else {
      if ((local_170[0] != 0x80) ||
         ((Object *)
          local_168.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start == (Object *)0x0)) goto LAB_001a3795;
      choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
      ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                       local_168.packedData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    if ((Allocator *)puVar4 == (Allocator *)0x0) {
      free(puVar13);
      pVVar9 = extraout_RAX_04;
    }
    else {
      pVVar9 = (Value *)(**(code **)(*(_func_int **)puVar4 + 0x20))(puVar4,puVar13);
    }
  }
LAB_001a3795:
  if ((ulong)uVar1 != 0) {
    sVar12 = 0;
    do {
      SubElementPath::SubElementPath(&local_100,sVar12);
      getSubElement(&local_1b0,source,&local_100);
      Value_const__((Value *)local_170,this,&local_1b0);
      ~Value(&local_1b0);
      local_100.indexes.numActive = 0;
      if ((4 < local_100.indexes.numAllocated) &&
         ((void *)CONCAT71(local_100.indexes.items._1_7_,local_100.indexes.items._0_1_) !=
          (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_100.indexes.items._1_7_,
                                           local_100.indexes.items._0_1_));
      }
      choc::value::Value::addArrayElement<choc::value::Value>
                (__return_storage_ptr__,(Value *)local_170);
      choc::value::Value::~Value((Value *)local_170);
      sVar12 = sVar12 + 1;
      pVVar9 = extraout_RAX_00;
    } while (uVar1 != sVar12);
  }
  return pVVar9;
}

Assistant:

choc::value::Value convert (const Value& source)
        {
            const auto& sourceType = source.getType();

            if (sourceType.isPrimitive())
            {
                if (sourceType.isInteger32())   return choc::value::createInt32 (source.getAsInt32());
                if (sourceType.isInteger64())   return choc::value::createInt64 (source.getAsInt64());
                if (sourceType.isFloat32())     return choc::value::createFloat32 (source.getAsFloat());
                if (sourceType.isFloat64())     return choc::value::createFloat64 (source.getAsDouble());
                if (sourceType.isBool())        return choc::value::createBool (source.getAsBool());
            }

            if (sourceType.isStringLiteral())
                return choc::value::createString (dictionary.getStringForHandle (source.getStringLiteral()));

            if (sourceType.isVector())
            {
                auto size = static_cast<uint32_t> (sourceType.getVectorSize());
                auto elementType = sourceType.getElementType();

                if (elementType.isInteger32())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt32(); });
                if (elementType.isInteger64())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt64(); });
                if (elementType.isFloat32())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsFloat(); });
                if (elementType.isFloat64())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsDouble(); });
                if (elementType.isBool())        return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsBool(); });
            }

            if (sourceType.isUnsizedArray())
            {
                auto target = constants.getValueForHandle (source.getUnsizedArrayContent());
                SOUL_ASSERT (target != nullptr);
                return convert (*target);
            }

            if (sourceType.isArray())
                return choc::value::createArray (static_cast<uint32_t> (sourceType.getArraySize()),
                                                 [&] (uint32_t i) { return convert (source.getSubElement (i)); });

            if (sourceType.isStruct())
            {
                auto& s = sourceType.getStructRef();
                auto o = choc::value::createObject (s.getName());
                size_t i = 0;

                for (auto& m : s.getMembers())
                    o.addMember (m.name, convert (source.getSubElement (i++)));

                return o;
            }

            SOUL_ASSERT_FALSE;
            return {};
        }